

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_socket_unix.cxx
# Opt level: O0

bool ndiSocketSleep(NDISocketHandle socket,int milliseconds)

{
  undefined1 local_20 [8];
  timespec ts;
  int milliseconds_local;
  NDISocketHandle socket_local;
  
  local_20 = (undefined1  [8])(long)(milliseconds / 1000);
  ts.tv_sec = (__time_t)((milliseconds % 1000) * 1000000);
  ts.tv_nsec._0_4_ = milliseconds;
  ts.tv_nsec._4_4_ = socket;
  nanosleep((timespec *)local_20,(timespec *)0x0);
  return true;
}

Assistant:

ndicapiExport bool ndiSocketSleep(NDISocketHandle socket, int milliseconds)
{
#if _POSIX_C_SOURCE >= 199309L
  struct timespec ts;
  ts.tv_sec = milliseconds / 1000;
  ts.tv_nsec = (milliseconds % 1000) * 1000000;
  nanosleep(&ts, NULL);
#else
  usleep(milliseconds * 1000);
#endif
  return true;
}